

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int is_supported_version(uint16_t v)

{
  size_t i;
  uint16_t v_local;
  
  i = 0;
  while( true ) {
    if (i == 4) {
      return 0;
    }
    if (supported_versions[i] == v) break;
    i = i + 1;
  }
  return 1;
}

Assistant:

static int is_supported_version(uint16_t v)
{
    size_t i;
    for (i = 0; i != PTLS_ELEMENTSOF(supported_versions); ++i)
        if (supported_versions[i] == v)
            return 1;
    return 0;
}